

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O2

node<adj_ribs_in_data> *
add_prefix<adj_ribs_in_data>
          (node<adj_ribs_in_data> *root,uint32_t prefix,uint8_t prefix_len,adj_ribs_in_data data,
          bool *is_updated)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  node<adj_ribs_in_data> *pnVar5;
  node<adj_ribs_in_data> *pnVar6;
  adj_ribs_in_data *paVar7;
  uint8_t max_prefix_len;
  undefined7 in_register_00000011;
  int iVar8;
  byte n;
  
  iVar8 = (int)CONCAT71(in_register_00000011,prefix_len) + -1;
  max_prefix_len = (uint8_t)iVar8;
  pnVar5 = search_prefix<adj_ribs_in_data>(root,prefix,max_prefix_len,false);
  n = pnVar5->prefix_len;
  while ((int)(uint)n < iVar8) {
    bVar3 = check_bit(prefix,n);
    if ((&pnVar5->node_0)[bVar3] == (node<adj_ribs_in_data> *)0x0) {
      pnVar6 = (node<adj_ribs_in_data> *)malloc(0x30);
      if (pnVar6 == (node<adj_ribs_in_data> *)0x0) goto LAB_001102f7;
      pnVar6->is_prefix = false;
      pnVar6->prefix = pnVar5->prefix;
      bVar1 = n + 1;
      pnVar6->prefix_len = bVar1;
      pnVar6->parent = pnVar5;
      pnVar6->node_0 = (node<adj_ribs_in_data> *)0x0;
      pnVar6->node_1 = (node<adj_ribs_in_data> *)0x0;
      bVar3 = check_bit(prefix,n);
      if (bVar3) {
        pnVar6->prefix = pnVar6->prefix | 0x80000000U >> (n & 0x1f);
        pnVar5->node_1 = pnVar6;
        pnVar5 = pnVar6;
        n = bVar1;
      }
      else {
        pnVar5->node_0 = pnVar6;
        pnVar5 = pnVar6;
        n = bVar1;
      }
    }
    else {
      pnVar5 = (&pnVar5->node_0)[bVar3];
      n = n + 1;
    }
  }
  bVar3 = check_bit(prefix,max_prefix_len);
  pnVar6 = (&pnVar5->node_0)[bVar3];
  if (pnVar6 == (node<adj_ribs_in_data> *)0x0) {
    pnVar6 = (node<adj_ribs_in_data> *)malloc(0x30);
    if (pnVar6 != (node<adj_ribs_in_data> *)0x0) {
      pnVar6->is_prefix = true;
      uVar2 = pnVar5->prefix;
      pnVar6->prefix = uVar2;
      bVar4 = check_bit(prefix,max_prefix_len);
      if (bVar4) {
        pnVar6->prefix = uVar2 | 1 << ((byte)(0x20 - prefix_len) & 0x1f);
      }
      pnVar6->prefix_len = prefix_len;
      paVar7 = (adj_ribs_in_data *)malloc(0x118);
      pnVar6->data = paVar7;
      if (paVar7 != (adj_ribs_in_data *)0x0) {
        memcpy(paVar7,&data,0x118);
        pnVar6->parent = pnVar5;
        pnVar6->node_0 = (node<adj_ribs_in_data> *)0x0;
        pnVar6->node_1 = (node<adj_ribs_in_data> *)0x0;
        (&pnVar5->node_0)[bVar3] = pnVar6;
        if (is_updated == (bool *)0x0) {
          return pnVar6;
        }
        *is_updated = false;
        return pnVar6;
      }
    }
    goto LAB_001102f7;
  }
  if (pnVar6->is_prefix == true) {
    bVar4 = true;
    if (is_updated != (bool *)0x0) {
LAB_001102ac:
      *is_updated = bVar4;
    }
  }
  else {
    pnVar6->is_prefix = true;
    if (is_updated != (bool *)0x0) {
      bVar4 = false;
      goto LAB_001102ac;
    }
  }
  paVar7 = pnVar6->data;
  if (paVar7 == (adj_ribs_in_data *)0x0) {
    paVar7 = (adj_ribs_in_data *)malloc(0x118);
    pnVar6->data = paVar7;
    paVar7 = (&pnVar5->node_0)[bVar3]->data;
    if (paVar7 == (adj_ribs_in_data *)0x0) {
LAB_001102f7:
      puts("Failed to allocate memory");
      exit(1);
    }
  }
  memcpy(paVar7,&data,0x118);
  return (&pnVar5->node_0)[bVar3];
}

Assistant:

node<DATA_TYPE>* add_prefix(node<DATA_TYPE>* root, uint32_t prefix, uint8_t prefix_len, DATA_TYPE data, bool* is_updated = nullptr){
    node<DATA_TYPE>* current = search_prefix(root, prefix, prefix_len-1);
    uint8_t current_prefix_len = current->prefix_len;
#ifdef TEST_RIB_TREE_TEST_TREE
    printf("Get prefix: %d\n", current_prefix_len);
#endif
    node<DATA_TYPE>** growth_address_ptr;
    while(current_prefix_len < prefix_len - 1){ // 枝を伸ばす
        if(check_bit(prefix, current_prefix_len)){
            growth_address_ptr = &current->node_1;
        }else{
            growth_address_ptr = &current->node_0;
        }
        if((*growth_address_ptr) != nullptr){
            current = *growth_address_ptr;
        }else{
            auto* growth_node = (node<DATA_TYPE>*) malloc(sizeof(node<DATA_TYPE>));
            if(growth_node == nullptr){
                printf("Failed to allocate memory\n");
                exit(EXIT_FAILURE);
            }
            growth_node->is_prefix = false;
            growth_node->prefix = current->prefix;
            growth_node->prefix_len = current_prefix_len+1;
            growth_node->parent = current;
            growth_node->node_0 = nullptr;
            growth_node->node_1 = nullptr;
            if(check_bit(prefix, current_prefix_len)){
                growth_node->prefix |= (0b01 << (32 - (current_prefix_len + 1)));
                current->node_1 = growth_node;
            }else{
                current->node_0 = growth_node;
            }
#ifdef TEST_RIB_TREE_TEST_TREE
            printf("Create: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(growth_node->prefix)}), current_prefix_len+1, growth_node);
#endif
            current = growth_node;
        }
        current_prefix_len++;
    }

    if(check_bit(prefix, prefix_len - 1)){
        growth_address_ptr = &current->node_1;
    }else{
        growth_address_ptr = &current->node_0;
    }
    if((*growth_address_ptr) == nullptr){
        auto* new_prefix = (node<DATA_TYPE>*) malloc(sizeof(node<DATA_TYPE>));
        if(new_prefix == nullptr){
            printf("Failed to allocate memory\n");
            exit(EXIT_FAILURE);
        }
        new_prefix->is_prefix = true;
        new_prefix->prefix = current->prefix;
        if(check_bit(prefix, prefix_len-1)){
            new_prefix->prefix |= (0b01 << (32 - prefix_len));
        }
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Create Prefix: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(new_prefix->prefix)}), prefix_len, new_prefix);
#endif
        new_prefix->prefix_len = prefix_len;
        new_prefix->data = (DATA_TYPE*) malloc(sizeof(DATA_TYPE));
        if(new_prefix->data == nullptr){
            printf("Failed to allocate memory\n");
            exit(EXIT_FAILURE);
        }
        memcpy(new_prefix->data, &data, sizeof(DATA_TYPE));
        new_prefix->parent = current;
        new_prefix->node_0 = nullptr;
        new_prefix->node_1 = nullptr;
        *growth_address_ptr = new_prefix;
        if(is_updated != nullptr){
            *is_updated = false;
        }
    }else{
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Exist: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(prefix)}), prefix_len, (*growth_address_ptr));
#endif
        if((*growth_address_ptr)->is_prefix){
            if(is_updated != nullptr){
                *is_updated = true; // 書き込み先のノードがもともとプレフィックスだったら、それは経路の更新である
            }
        }else{
            (*growth_address_ptr)->is_prefix = true;
            if(is_updated != nullptr){
                *is_updated = false; // 書き込み先のノードがもともとプレフィックスでなかったら、それは経路の追加である
            }
        }
        if((*growth_address_ptr)->data == nullptr){
            (*growth_address_ptr)->data = (DATA_TYPE*) malloc(sizeof(DATA_TYPE));
            if((*growth_address_ptr)->data == nullptr){
                printf("Failed to allocate memory\n");
                exit(EXIT_FAILURE);
            }
        }
        memcpy((*growth_address_ptr)->data, &data, sizeof(DATA_TYPE));
    }

    return *growth_address_ptr;
}